

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O2

void __thiscall MainWindow::closeEvent(MainWindow *this,QCloseEvent *evt)

{
  bool bVar1;
  QArrayDataPointer<char> local_60;
  QVariant local_48;
  QSettings settings;
  
  bVar1 = maybeSave(this);
  if (bVar1) {
    QSettings::QSettings(&settings,(QObject *)0x0);
    QSettings::beginGroup((QString *)&settings);
    QWidget::saveGeometry();
    QVariant::QVariant(&local_48,(QByteArray *)&local_60);
    QSettings::setValue((QString *)&settings,(QVariant *)MainWindowTU::KEY_GEOMETRY);
    QVariant::~QVariant(&local_48);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
    QMainWindow::saveState((int)&local_60);
    QVariant::QVariant(&local_48,(QByteArray *)&local_60);
    QSettings::setValue((QString *)&settings,(QVariant *)MainWindowTU::KEY_WINDOW_STATE);
    QVariant::~QVariant(&local_48);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
    QSplitter::saveState();
    QVariant::QVariant(&local_48,(QByteArray *)&local_60);
    QSettings::setValue((QString *)&settings,(QVariant *)MainWindowTU::KEY_HSPLITTER);
    QVariant::~QVariant(&local_48);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
    QSplitter::saveState();
    QVariant::QVariant(&local_48,(QByteArray *)&local_60);
    QSettings::setValue((QString *)&settings,(QVariant *)MainWindowTU::KEY_VSPLITTER);
    QVariant::~QVariant(&local_48);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
    evt[0xc] = (QCloseEvent)0x1;
    QSettings::~QSettings(&settings);
  }
  else {
    evt[0xc] = (QCloseEvent)0x0;
  }
  return;
}

Assistant:

void MainWindow::closeEvent(QCloseEvent *evt) {
    if (maybeSave()) {
        // user saved or discarded changes, close the window
        #ifdef QT_DEBUG
        if (mSaveConfig) {
        #endif
            QSettings settings;
            settings.beginGroup(TU::KEY_MAIN_WINDOW);
            settings.setValue(TU::KEY_GEOMETRY, saveGeometry());
            settings.setValue(TU::KEY_WINDOW_STATE, saveState(TU::WINDOW_STATE_VERSION));
            // splitters
            settings.setValue(TU::KEY_HSPLITTER, mHSplitter->saveState());
            settings.setValue(TU::KEY_VSPLITTER, mVSplitter->saveState());
        #ifdef QT_DEBUG
        }
        #endif
        evt->accept();
    } else {
        // user aborted closing, ignore this event
        evt->ignore();
    }
    
}